

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

void NetworkDataType::deserializedata<std::__cxx11::string,int,int,int,int,int>
               (binarydata *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
               int *args_2,int *args_3,int *args_4,int *args_5)

{
  Options local_2b9;
  PortableBinaryInputArchive archive;
  stringstream stream;
  
  std::__cxx11::string::string((string *)&archive,(string *)data);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&archive,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&archive);
  local_2b9.itsInputEndianness = cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (&archive,(istream *)&stream,&local_2b9);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::PortableBinaryInputArchive,1u> *)&archive,args,args_1,args_2,
             args_3,args_4,args_5);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,_1U>::~InputArchive
            (&archive.super_InputArchive<cereal::PortableBinaryInputArchive,_1U>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }